

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineComputeChain::Run(AdvancedPipelineComputeChain *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *textures;
  float *pfVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  ulong uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [16];
  bool bVar10;
  int i;
  GLuint GVar11;
  ComputeShaderBase *epsilon;
  bool *compile_error;
  undefined8 uVar12;
  Matrix<float,_4,_4> *mat;
  ComputeShaderBase *this_01;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> data_3;
  Matrix<float,_4,_4> local_208;
  Vector<float,_3> local_1c8;
  stringstream ss;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [3] [16];
  Matrix<float,_4,_4> local_178 [5];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar14 = 0;
  while (lVar14 != 0xc) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data_3,
               "\nstruct S0 {\n  int m0[8];\n};\nstruct S1 {\n  S0 m0[8];\n};\nlayout(binding = 0, std430) buffer Buffer0 {\n  int m0[5];\n  S1 m1[8];\n} g_buffer0;\nlayout(binding = 1, std430) buffer Buffer1 {\n  uint data[8];\n} g_buffer1;\nlayout(binding = 2, std430) buffer Buffer2 {\n  int data[256];\n} g_buffer2;\nlayout(binding = 3, std430) buffer Buffer3 {\n  int data[256];\n} g_buffer3;\nlayout(binding = 4, std430) buffer Buffer4 {\n  mat4 data0;\n  mat4 data1;\n} g_buffer4;\nlayout(binding = 0, rgba32f) uniform image2D g_image0;\nlayout(binding = 1, offset = 8) uniform atomic_uint g_counter[2];"
               ,(allocator<char> *)&local_1c8);
    std::operator<<((ostream *)local_1a8,(string *)&data_3);
    std::__cxx11::string::~string((string *)&data_3);
    std::operator<<((ostream *)local_1a8,
                    (char *)((long)&DAT_0168d0c0 + (long)*(int *)((long)&DAT_0168d0c0 + lVar14)));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    GVar11 = ComputeShaderBase::CreateComputeProgram
                       (&this->super_ComputeShaderBase,(string *)&local_208);
    *(GLuint *)((long)this->m_program + lVar14) = GVar11;
    std::__cxx11::string::~string((string *)&local_208);
    glu::CallLogWrapper::glLinkProgram(this_00,*(GLuint *)((long)this->m_program + lVar14));
    bVar10 = ComputeShaderBase::CheckProgram
                       (&this->super_ComputeShaderBase,*(GLuint *)((long)this->m_program + lVar14),
                        compile_error);
    lVar14 = lVar14 + 4;
    if (!bVar10) {
      return -1;
    }
  }
  buffers = this->m_storage_buffer;
  glu::CallLogWrapper::glGenBuffers(this_00,4,buffers);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&ss,0x205,(allocator_type *)&data_3);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,uStack_1b0 - (long)_ss,_ss,0x88e6);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ss);
  local_1a8[0] = (undefined1  [16])0x0;
  _ss = (undefined1  [16])0x0;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,&ss,0x88e6);
  data_3.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&ss,0x200,(value_type_conflict1 *)&data_3,
             (allocator_type *)&local_208);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,uStack_1b0 - (long)_ss,_ss,0x88e6);
  glu::CallLogWrapper::glBindBufferRange
            (this_00,0x90d2,2,this->m_storage_buffer[2],0,
             (ulong)(uStack_1b0 - (long)_ss) >> 1 & 0xfffffffffffffffe);
  uVar13 = (ulong)(uStack_1b0 - (long)_ss) >> 1 & 0x7ffffffffffffffe;
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,3,this->m_storage_buffer[2],uVar13,uVar13);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ss);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&data_3,2,(allocator_type *)&ss);
  local_208.m_data.m_data[0].m_data[0] = 1.0;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&ss,(float *)&local_208);
  tcu::Matrix<float,_4,_4>::operator=
            ((Matrix<float,_4,_4> *)
             CONCAT44(data_3.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      data_3.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_),(Matrix<float,_4,_4> *)&ss);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[3]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,
             (long)data_3.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)CONCAT44(data_3.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            data_3.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_),
             (void *)CONCAT44(data_3.
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              data_3.
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_),0x88e6);
  std::_Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
  ~_Vector_base(&data_3.
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               );
  _ss = (undefined1  [16])0x0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,1,this->m_counter_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x10,&ss,0x88e6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&data_3,0.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss,0x10,
             (value_type *)&data_3,(allocator_type *)&local_208);
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,4,4,0,0x1908,0x1406,_ss);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glDispatchCompute(this_00,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2020);
  glu::CallLogWrapper::glDispatchCompute(this_00,3,2,2);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
  glu::CallLogWrapper::glDispatchCompute(this_00,4,3,7);
  glu::CallLogWrapper::glMemoryBarrier(this_00,800);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss,0x10,
             (allocator_type *)&data_3);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*textures,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_3,0x40,
             (allocator_type *)&local_208);
  epsilon = (ComputeShaderBase *)
            CONCAT44(data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     data_3.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
  glu::CallLogWrapper::glReadPixels(this_00,0,0,4,4,0x1908,0x1401,epsilon);
  auVar9 = _DAT_0167ea80;
  for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 4) {
    uVar2 = *(undefined4 *)
             (CONCAT44(data_3.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       data_3.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar13);
    uVar7 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar7;
    auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
    auVar5[8] = (char)((uint)uVar2 >> 0x10);
    auVar5._0_8_ = uVar7;
    auVar5[9] = 0;
    auVar5._10_3_ = auVar4._10_3_;
    auVar8._5_8_ = 0;
    auVar8._0_5_ = auVar5._8_5_;
    auVar6[4] = (char)((uint)uVar2 >> 8);
    auVar6._0_4_ = (int)uVar7;
    auVar6[5] = 0;
    auVar6._6_7_ = SUB137(auVar8 << 0x40,6);
    auVar16._0_8_ = (double)(int)uVar7;
    auVar16._8_8_ = (double)auVar6._4_4_;
    auVar15._0_8_ = (double)auVar5._8_4_;
    auVar15._8_8_ = (double)(uint3)(auVar4._10_3_ >> 0x10);
    auVar15 = divpd(auVar15,auVar9);
    auVar16 = divpd(auVar16,auVar9);
    pfVar1 = (_ss->g_color_eps).m_data + (uVar13 - 0xe);
    *(ulong *)pfVar1 = CONCAT44((float)auVar16._8_8_,(float)auVar16._0_8_);
    *(ulong *)(pfVar1 + 2) = CONCAT44((float)auVar15._8_8_,(float)auVar15._0_8_);
    epsilon = _ss;
  }
  lVar14 = (uStack_1b0 - (long)_ss >> 4) + 1;
  this_01 = _ss;
  while (lVar14 = lVar14 + -1, lVar14 != 0) {
    local_208.m_data.m_data[0].m_data._0_8_ = (pointer)0x3f0000003e800000;
    local_208.m_data.m_data[0].m_data[2] = 0.75;
    local_208.m_data.m_data[0].m_data[3] = 1.0;
    bVar10 = ComputeShaderBase::ColorEqual
                       (this_01,(vec4 *)&local_208,&(this->super_ComputeShaderBase).g_color_eps,
                        (vec4 *)epsilon);
    this_01 = (ComputeShaderBase *)
              &(this_01->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_log;
    if (!bVar10) {
      anon_unknown_0::Output("Invalid data at texture.\n");
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data_3);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    &ss);
      return -1;
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data_3);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ss);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&ss,0x205,(allocator_type *)&data_3);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,uStack_1b0 - (long)_ss,_ss);
  uVar13 = 5;
  while (uVar13 < (ulong)(uStack_1b0 - (long)_ss >> 2)) {
    uVar3 = *(uint *)((long)_ss + uVar13 * 4);
    uVar13 = uVar13 + 1;
    if (uVar3 != 4) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,2);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&ss);
      return -1;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ss);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x20,&ss);
  for (uVar13 = 0; uVar13 != 4; uVar13 = uVar13 + 1) {
    if (uVar13 != *(uint *)(&ss + uVar13 * 4)) {
      anon_unknown_0::Output
                ("Data is: %d should be: %d.\n",(ulong)*(uint *)(&ss + uVar13 * 4),
                 uVar13 & 0xffffffff);
      return -1;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&ss,0x200,(allocator_type *)&data_3);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,uStack_1b0 - (long)_ss,_ss);
  lVar14 = 0;
  uVar12 = 5;
  do {
    if (lVar14 == 2) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&ss);
      tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&ss);
      tcu::Matrix<float,_4,_4>::Matrix(local_178);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x80,&ss);
      local_208.m_data.m_data[0].m_data._0_8_ = (pointer)0x41a0000041200000;
      local_208.m_data.m_data[0].m_data[2] = 30.0;
      tcu::translationMatrix<float,_3>
                ((Matrix<float,_4,_4> *)&data_3,(Vector<float,_3> *)&local_208);
      bVar10 = tcu::operator!=((Matrix<float,_4,_4> *)&ss,(Matrix<float,_4,_4> *)&data_3);
      if (!bVar10) {
        local_1c8.m_data[0] = 10.0;
        local_1c8.m_data[1] = 20.0;
        local_1c8.m_data[2] = 30.0;
        tcu::translationMatrix<float,_3>(&local_208,&local_1c8);
        tcu::transpose<float,4,4>((Matrix<float,_4,_4> *)&data_3,(tcu *)&local_208,mat);
        bVar10 = tcu::operator!=(local_178,(Matrix<float,_4,_4> *)&data_3);
        if (!bVar10) {
          _ss = (undefined1  [16])0x0;
          glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x10,&ss);
          uVar3 = uStack_1b0._4_4_;
          if (uStack_1b0._4_4_ != 4) {
            anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uStack_1b0._4_4_,4);
          }
          return -(ulong)(uVar3 != 4);
        }
      }
      anon_unknown_0::Output("Data is incorrect.\n");
      return -1;
    }
    uVar3 = *(uint *)((long)_ss + lVar14 * 4);
    if (uVar3 != 5) goto LAB_009cd94b;
    uVar3 = *(uint *)((long)_ss + 0x400 + lVar14 * 4);
    lVar14 = lVar14 + 1;
  } while (uVar3 == 7);
  uVar12 = 7;
LAB_009cd94b:
  anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,uVar12);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ss);
  return -1;
}

Assistant:

virtual long Run()
	{
		using namespace tcu;

		for (int i = 0; i < 3; ++i)
		{
			m_program[i] = CreateComputeProgram(GenGLSL(i));
			glLinkProgram(m_program[i]);
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);
		/* storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(int)), &data[0], GL_STATIC_COPY);
		}
		/* storage buffer 1 */
		{
			const GLuint data[8] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512, 7);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(GLint)), &data[0], GL_STATIC_COPY);

			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2], 0,
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[2],
							  (GLintptr)(sizeof(GLint) * data.size() / 2),
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
		}
		/* storage buffer 4 */
		{
			std::vector<mat4> data(2);
			data[0] = mat4(1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(mat4)), &data[0], GL_STATIC_COPY);
		}
		/* counter buffer */
		{
			GLuint data[4] = { 0 };
			glGenBuffers(1, &m_counter_buffer);
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, m_counter_buffer);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* texture */
		{
			std::vector<vec4> data(4 * 4, vec4(0.0f));
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 4, 4, 0, GL_RGBA, GL_FLOAT, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glUseProgram(m_program[0]);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT | GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(3, 2, 2);

		glUseProgram(m_program[1]);
		glDispatchCompute(4, 3, 7);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_TEXTURE_UPDATE_BARRIER_BIT |
						GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		/* validate texture */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!ColorEqual(data[i], vec4(0.25f, 0.5f, 0.75f, 1.0f), g_color_eps))
				{
					Output("Invalid data at texture.\n");
					return ERROR;
				}
			}
		}
		/* validate storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(data.size() * sizeof(int)), &data[0]);
			for (std::size_t i = 5; i < data.size(); ++i)
			{
				if (data[i] != 4)
				{
					Output("Data is: %d should be: %d.\n", data[i], 2);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 1 */
		{
			GLuint data[8];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != i)
				{
					Output("Data is: %d should be: %d.\n", data[i], i);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(sizeof(GLint) * data.size()), &data[0]);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != 5)
				{
					Output("Data is: %d should be: %d.\n", data[i], 5);
					return ERROR;
				}
				if (data[i + 256] != 7)
				{
					Output("Data is: %d should be: %d.\n", data[i + 256], 7);
					return ERROR;
				}
			}
		}
		/* validate storage buffer 4 */
		{
			mat4 data[2];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0](0, 0));
			if (data[0] != translationMatrix(vec3(10.0f, 20.0f, 30.0f)))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
			if (data[1] != transpose(translationMatrix(vec3(10.0f, 20.0f, 30.0f))))
			{
				Output("Data is incorrect.\n");
				return ERROR;
			}
		}
		/* validate counter buffer */
		{
			GLuint data[4] = { 0 };
			glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
			if (data[3] != 4)
			{
				Output("Data is: %d should be: %d.\n", data[3], 4);
				return ERROR;
			}
		}

		return NO_ERROR;
	}